

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

RegOpnd * __thiscall IR::Opnd::FindRegUse(Opnd *this,RegOpnd *regOpnd)

{
  StackSym *pSVar1;
  bool bVar2;
  IndirOpnd *this_00;
  RegOpnd *pRVar3;
  IndirOpnd *indirOpnd;
  StackSym *regSym;
  RegOpnd *regOpnd_local;
  Opnd *this_local;
  
  pSVar1 = regOpnd->m_sym;
  bVar2 = IsRegOpnd(this);
  if (bVar2) {
    pRVar3 = AsRegOpnd(this);
    if (pRVar3->m_sym == pSVar1) {
      pRVar3 = AsRegOpnd(this);
      return pRVar3;
    }
  }
  else {
    bVar2 = IsIndirOpnd(this);
    if (bVar2) {
      this_00 = AsIndirOpnd(this);
      pRVar3 = IndirOpnd::GetBaseOpnd(this_00);
      if ((pRVar3 != (RegOpnd *)0x0) &&
         (pRVar3 = IndirOpnd::GetBaseOpnd(this_00), pRVar3->m_sym == pSVar1)) {
        pRVar3 = IndirOpnd::GetBaseOpnd(this_00);
        return pRVar3;
      }
      pRVar3 = IndirOpnd::GetIndexOpnd(this_00);
      if ((pRVar3 != (RegOpnd *)0x0) &&
         (pRVar3 = IndirOpnd::GetIndexOpnd(this_00), pRVar3->m_sym == pSVar1)) {
        pRVar3 = IndirOpnd::GetIndexOpnd(this_00);
        return pRVar3;
      }
    }
  }
  return (RegOpnd *)0x0;
}

Assistant:

IR::RegOpnd *
Opnd::FindRegUse(IR::RegOpnd *regOpnd)
{
    StackSym *regSym = regOpnd->m_sym;

    if (this->IsRegOpnd())
    {
        if (this->AsRegOpnd()->m_sym == regSym)
        {
            return this->AsRegOpnd();
        }
    }
    else if (this->IsIndirOpnd())
    {
        IndirOpnd *indirOpnd = this->AsIndirOpnd();
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetBaseOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetBaseOpnd();
        }
        if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetIndexOpnd();
        }
    }

    return nullptr;
}